

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O0

void __thiscall
google::protobuf::FieldDescriptor::DebugString(FieldDescriptor *this,int depth,string *contents)

{
  undefined8 uVar1;
  bool bVar2;
  Type TVar3;
  Label LVar4;
  int value;
  EnumDescriptor *this_00;
  string *psVar5;
  Descriptor *pDVar6;
  FieldOptions *options;
  string *local_530;
  undefined1 local_4c0 [8];
  string formatted_options;
  SubstituteArg local_470;
  SubstituteArg local_440;
  SubstituteArg local_410;
  SubstituteArg local_3e0;
  SubstituteArg local_3b0;
  SubstituteArg local_380;
  SubstituteArg local_350;
  SubstituteArg local_320;
  string local_2f0;
  SubstituteArg local_2d0;
  byte local_299;
  undefined1 local_298 [7];
  bool bracketed;
  SubstituteArg local_268;
  SubstituteArg local_238;
  SubstituteArg local_208;
  SubstituteArg local_1d8;
  SubstituteArg local_1a8;
  SubstituteArg local_178;
  SubstituteArg local_148;
  SubstituteArg local_118;
  SubstituteArg local_e8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_98;
  undefined1 local_78 [8];
  string field_type;
  allocator<char> local_41;
  undefined1 local_40 [8];
  string prefix;
  string *contents_local;
  int depth_local;
  FieldDescriptor *this_local;
  
  prefix.field_2._8_8_ = contents;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_40,(long)(depth * 2),' ',&local_41);
  std::allocator<char>::~allocator(&local_41);
  std::__cxx11::string::string((string *)local_78);
  TVar3 = type(this);
  if (TVar3 == TYPE_MESSAGE) {
    pDVar6 = message_type(this);
    psVar5 = Descriptor::full_name_abi_cxx11_(pDVar6);
    std::operator+(&local_98,".",psVar5);
    std::__cxx11::string::operator=((string *)local_78,(string *)&local_98);
    std::__cxx11::string::~string((string *)&local_98);
  }
  else if (TVar3 == TYPE_ENUM) {
    this_00 = enum_type(this);
    psVar5 = EnumDescriptor::full_name_abi_cxx11_(this_00);
    std::operator+(&local_b8,".",psVar5);
    std::__cxx11::string::operator=((string *)local_78,(string *)&local_b8);
    std::__cxx11::string::~string((string *)&local_b8);
  }
  else {
    TVar3 = type(this);
    std::__cxx11::string::operator=((string *)local_78,*(char **)(kTypeToName + (ulong)TVar3 * 8));
  }
  uVar1 = prefix.field_2._8_8_;
  strings::internal::SubstituteArg::SubstituteArg(&local_e8,(string *)local_40);
  LVar4 = label(this);
  strings::internal::SubstituteArg::SubstituteArg
            (&local_118,*(char **)(kLabelToName + (ulong)LVar4 * 8));
  strings::internal::SubstituteArg::SubstituteArg(&local_148,(string *)local_78);
  TVar3 = type(this);
  if (TVar3 == TYPE_GROUP) {
    pDVar6 = message_type(this);
    local_530 = Descriptor::name_abi_cxx11_(pDVar6);
  }
  else {
    local_530 = name_abi_cxx11_(this);
  }
  strings::internal::SubstituteArg::SubstituteArg(&local_178,local_530);
  value = number(this);
  strings::internal::SubstituteArg::SubstituteArg(&local_1a8,value);
  strings::internal::SubstituteArg::SubstituteArg(&local_1d8);
  strings::internal::SubstituteArg::SubstituteArg(&local_208);
  strings::internal::SubstituteArg::SubstituteArg(&local_238);
  strings::internal::SubstituteArg::SubstituteArg(&local_268);
  strings::internal::SubstituteArg::SubstituteArg((SubstituteArg *)local_298);
  strings::SubstituteAndAppend
            ((string *)uVar1,"$0$1 $2 $3 = $4",&local_e8,&local_118,&local_148,&local_178,&local_1a8
             ,&local_1d8,&local_208,&local_238,&local_268,(SubstituteArg *)local_298);
  local_299 = 0;
  bVar2 = has_default_value(this);
  uVar1 = prefix.field_2._8_8_;
  if (bVar2) {
    local_299 = 1;
    DefaultValueAsString_abi_cxx11_(&local_2f0,this,true);
    strings::internal::SubstituteArg::SubstituteArg(&local_2d0,&local_2f0);
    strings::internal::SubstituteArg::SubstituteArg(&local_320);
    strings::internal::SubstituteArg::SubstituteArg(&local_350);
    strings::internal::SubstituteArg::SubstituteArg(&local_380);
    strings::internal::SubstituteArg::SubstituteArg(&local_3b0);
    strings::internal::SubstituteArg::SubstituteArg(&local_3e0);
    strings::internal::SubstituteArg::SubstituteArg(&local_410);
    strings::internal::SubstituteArg::SubstituteArg(&local_440);
    strings::internal::SubstituteArg::SubstituteArg(&local_470);
    strings::internal::SubstituteArg::SubstituteArg
              ((SubstituteArg *)((long)&formatted_options.field_2 + 8));
    strings::SubstituteAndAppend
              ((string *)uVar1," [default = $0",&local_2d0,&local_320,&local_350,&local_380,
               &local_3b0,&local_3e0,&local_410,&local_440,&local_470,
               (SubstituteArg *)((long)&formatted_options.field_2 + 8));
    std::__cxx11::string::~string((string *)&local_2f0);
  }
  std::__cxx11::string::string((string *)local_4c0);
  options = FieldDescriptor::options(this);
  bVar2 = anon_unknown_1::FormatBracketedOptions(depth,&options->super_Message,(string *)local_4c0);
  if (bVar2) {
    std::__cxx11::string::append((char *)prefix.field_2._8_8_);
    local_299 = 1;
    std::__cxx11::string::append((string *)prefix.field_2._8_8_);
  }
  if ((local_299 & 1) != 0) {
    std::__cxx11::string::append((char *)prefix.field_2._8_8_);
  }
  TVar3 = type(this);
  if (TVar3 == TYPE_GROUP) {
    pDVar6 = message_type(this);
    Descriptor::DebugString(pDVar6,depth,(string *)prefix.field_2._8_8_);
  }
  else {
    std::__cxx11::string::append((char *)prefix.field_2._8_8_);
  }
  std::__cxx11::string::~string((string *)local_4c0);
  std::__cxx11::string::~string((string *)local_78);
  std::__cxx11::string::~string((string *)local_40);
  return;
}

Assistant:

void FieldDescriptor::DebugString(int depth, string *contents) const {
  string prefix(depth * 2, ' ');
  string field_type;
  switch (type()) {
    case TYPE_MESSAGE:
      field_type = "." + message_type()->full_name();
      break;
    case TYPE_ENUM:
      field_type = "." + enum_type()->full_name();
      break;
    default:
      field_type = kTypeToName[type()];
  }

  strings::SubstituteAndAppend(contents, "$0$1 $2 $3 = $4",
                               prefix,
                               kLabelToName[label()],
                               field_type,
                               type() == TYPE_GROUP ? message_type()->name() :
                                                      name(),
                               number());

  bool bracketed = false;
  if (has_default_value()) {
    bracketed = true;
    strings::SubstituteAndAppend(contents, " [default = $0",
                                 DefaultValueAsString(true));
  }

  string formatted_options;
  if (FormatBracketedOptions(depth, options(), &formatted_options)) {
    contents->append(bracketed ? ", " : " [");
    bracketed = true;
    contents->append(formatted_options);
  }

  if (bracketed) {
    contents->append("]");
  }

  if (type() == TYPE_GROUP) {
    message_type()->DebugString(depth, contents);
  } else {
    contents->append(";\n");
  }
}